

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O3

void __thiscall wasm::Analyzer::addReferences(Analyzer *this,Expression *curr)

{
  pointer puVar1;
  Name name;
  Global *pGVar2;
  __hashtable *__h_1;
  pointer pNVar3;
  Module *pMVar4;
  __hashtable *__h;
  undefined1 auStack_1a8 [8];
  ReferenceFinder finder;
  Expression *curr_local;
  Name func;
  _Hashtable<std::pair<wasm::ModuleElementKind,wasm::Name>,std::pair<wasm::ModuleElementKind,wasm::Name>,std::allocator<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::hash<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_50;
  int iStack_48;
  undefined4 uStack_44;
  pair<wasm::ModuleElementKind,_wasm::Name> element;
  
  auStack_1a8 = (undefined1  [8])0x0;
  finder.super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
  super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.replacep =
       (Expression **)0x0;
  finder.structFields.
  super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)curr;
  memset((Expression ***)
         ((long)(finder.
                 super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                 .super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
                 stack.fixed._M_elems + 9) + 8),0,0x88);
  finder.super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
  super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.currFunction =
       (Function *)this->module;
  Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>::walk
            ((Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_> *)
             auStack_1a8,
             (Expression **)
             &finder.structFields.
              super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (finder.super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
      super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.currModule !=
      (Module *)
      finder.elements.
      super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pMVar4 = finder.
             super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
             super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
             currModule;
    do {
      puVar1 = (pMVar4->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      element.second.super_IString.str._M_len._0_4_ = SUB84(puVar1,0);
      element.second.super_IString.str._M_len._4_4_ = (undefined4)((ulong)puVar1 >> 0x20);
      iStack_48 = *(int *)&(pMVar4->exports).
                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
      uStack_44 = *(undefined4 *)
                   ((long)&(pMVar4->exports).
                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 4);
      element.first =
           *(ModuleElementKind *)
            &(pMVar4->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
      element._4_4_ =
           *(undefined4 *)
            ((long)&(pMVar4->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 4);
      curr_local = (Expression *)&this->referenced;
      std::
      _Hashtable<std::pair<wasm::ModuleElementKind,wasm::Name>,std::pair<wasm::ModuleElementKind,wasm::Name>,std::allocator<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::hash<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::pair<wasm::ModuleElementKind,wasm::Name>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::ModuleElementKind,wasm::Name>,true>>>>
                ((_Hashtable<std::pair<wasm::ModuleElementKind,wasm::Name>,std::pair<wasm::ModuleElementKind,wasm::Name>,std::allocator<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::hash<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&this->referenced,&iStack_48,&curr_local);
      if (iStack_48 == 1) {
        name.super_IString.str._M_len._4_4_ = element._4_4_;
        name.super_IString.str._M_len._0_4_ = element.first;
        name.super_IString.str._M_str._0_4_ = (undefined4)element.second.super_IString.str._M_len;
        name.super_IString.str._M_str._4_4_ = element.second.super_IString.str._M_len._4_4_;
        pGVar2 = Module::getGlobal(this->module,name);
        if ((pGVar2->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          addReferences(this,pGVar2->init);
        }
      }
      pMVar4 = (Module *)&pMVar4->functions;
    } while (pMVar4 != (Module *)
                       finder.elements.
                       super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)finder.callRefTypes.
               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage !=
      finder.refFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pNVar3 = (pointer)finder.callRefTypes.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
    do {
      element.first = (ModuleElementKind)(pNVar3->super_IString).str._M_len;
      element._4_4_ = *(undefined4 *)((long)&(pNVar3->super_IString).str._M_len + 4);
      curr_local = (Expression *)(pNVar3->super_IString).str._M_len;
      func.super_IString.str._M_len._0_4_ = *(undefined4 *)&(pNVar3->super_IString).str._M_str;
      func.super_IString.str._M_len._4_4_ =
           *(undefined4 *)((long)&(pNVar3->super_IString).str._M_str + 4);
      iStack_48 = 0;
      local_50 = (_Hashtable<std::pair<wasm::ModuleElementKind,wasm::Name>,std::pair<wasm::ModuleElementKind,wasm::Name>,std::allocator<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::hash<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&this->referenced;
      element.second.super_IString.str._M_len._0_4_ = (undefined4)func.super_IString.str._M_len;
      element.second.super_IString.str._M_len._4_4_ = func.super_IString.str._M_len._4_4_;
      std::
      _Hashtable<std::pair<wasm::ModuleElementKind,wasm::Name>,std::pair<wasm::ModuleElementKind,wasm::Name>,std::allocator<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::hash<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::pair<wasm::ModuleElementKind,wasm::Name>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::ModuleElementKind,wasm::Name>,true>>>>
                ((_Hashtable<std::pair<wasm::ModuleElementKind,wasm::Name>,std::pair<wasm::ModuleElementKind,wasm::Name>,std::allocator<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::hash<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&this->referenced,&iStack_48,&local_50);
      pNVar3 = pNVar3 + 1;
    } while (pNVar3 != finder.refFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  }
  if (finder.refFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(finder.refFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)finder.structFields.
                          super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)finder.refFuncs.
                          super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (finder.callRefTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(finder.callRefTypes.
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)finder.refFuncs.
                          super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)finder.callRefTypes.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (finder.elements.
      super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(finder.elements.
                    super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)finder.callRefTypes.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)finder.elements.
                          super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (finder.super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
      super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.currModule !=
      (Module *)0x0) {
    operator_delete(finder.
                    super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                    .
                    super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                    .currModule,
                    (long)finder.elements.
                          super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)finder.
                          super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                          .
                          super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                          .currModule);
  }
  if (finder.super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
      super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.stack.fixed.
      _M_elems[9].currp != (Expression **)0x0) {
    operator_delete(finder.
                    super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                    .
                    super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)finder.
                          super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                          .
                          super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)finder.
                          super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                          .
                          super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  return;
}

Assistant:

void addReferences(Expression* curr) {
    // Find references anywhere in this expression so we can apply them.
    ReferenceFinder finder;
    finder.setModule(module);
    finder.walk(curr);

    for (auto element : finder.elements) {
      referenced.insert(element);

      auto& [kind, value] = element;
      if (kind == ModuleElementKind::Global) {
        // Like functions, (non-imported) globals have contents. For functions,
        // things are simple: if a function ends up with references but no uses
        // then we can simply empty out the function (by setting its body to an
        // unreachable). We don't have a simple way to do the same for globals,
        // unfortunately. For now, scan the global's contents and add references
        // as needed.
        // TODO: We could try to empty the global out, for example, replace it
        //       with a null if it is nullable, or replace all gets of it with
        //       something else, but that is not trivial.
        auto* global = module->getGlobal(value);
        if (!global->imported()) {
          // Note that infinite recursion is not a danger here since a global
          // can only refer to previous globals.
          addReferences(global->init);
        }
      }
    }

    for (auto func : finder.refFuncs) {
      // If a function ends up referenced but not used then later down we will
      // empty it out by replacing its body with an unreachable, which always
      // validates. For that reason all we need to do here is mark the function
      // as referenced - we don't need to do anything with the body.
      //
      // Note that it is crucial that we do not call useRefFunc() here: we are
      // just adding a reference to the function, and not actually using the
      // RefFunc. (Only useRefFunc() + a CallRef of the proper type are enough
      // to make a function itself used.)
      referenced.insert({ModuleElementKind::Function, func});
    }

    // Note: nothing to do with |callRefTypes| and |structFields|, which only
    // involve types. This function only cares about references to module
    // elements like functions, globals, and tables. (References to types are
    // handled in an entirely different way in Binaryen IR, and we don't need to
    // worry about it.)
  }